

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeOpen(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCursor)

{
  long *__s;
  undefined8 *in_RSI;
  long in_RDI;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  int rc;
  undefined4 local_14;
  
  local_14 = 7;
  __s = (long *)sqlite3_malloc64(0xaaaaaaaaaaaaaaaa);
  if (__s != (long *)0x0) {
    memset(__s,0,0x128);
    *__s = in_RDI;
    local_14 = 0;
    *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + 1;
  }
  *in_RSI = __s;
  return local_14;
}

Assistant:

static int rtreeOpen(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCursor){
  int rc = SQLITE_NOMEM;
  Rtree *pRtree = (Rtree *)pVTab;
  RtreeCursor *pCsr;

  pCsr = (RtreeCursor *)sqlite3_malloc64(sizeof(RtreeCursor));
  if( pCsr ){
    memset(pCsr, 0, sizeof(RtreeCursor));
    pCsr->base.pVtab = pVTab;
    rc = SQLITE_OK;
    pRtree->nCursor++;
  }
  *ppCursor = (sqlite3_vtab_cursor *)pCsr;

  return rc;
}